

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O1

void __thiscall
mp::internal::MemoryMappedFileBase::map(MemoryMappedFileBase *this,int fd,size_t size)

{
  void *pvVar1;
  SystemError *this_00;
  int *piVar2;
  
  pvVar1 = mmap((void *)0x0,size,1,2,fd,0);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    *(void **)this = pvVar1;
    *(size_t *)(this + 8) = size;
    return;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  fmt::SystemError::SystemError(this_00,*piVar2,(CStringRef)0x10f03f);
  __cxa_throw(this_00,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void mp::internal::MemoryMappedFileBase::map(int fd, std::size_t size) {
  char *start = reinterpret_cast<char*>(
      mmap(0, size, PROT_READ, MAP_PRIVATE, fd, 0));
  if (start == MAP_FAILED)
    throw SystemError(errno, "cannot map file");
  start_ = start;
  size_ = size;
}